

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

short duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<unsigned_int,short>
                (uint input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  short sVar2;
  short result_value;
  short local_44;
  allocator local_41;
  string local_40;
  
  bVar1 = TryCastToDecimal::Operation<unsigned_int,short>
                    (input,&local_44,*(CastParameters **)((long)dataptr + 8),
                     *(uint8_t *)((long)dataptr + 0x18),*(uint8_t *)((long)dataptr + 0x19));
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"Failed to cast decimal value",&local_41);
    sVar2 = HandleVectorCastError::Operation<short>(&local_40,mask,idx,(VectorTryCastData *)dataptr)
    ;
    ::std::__cxx11::string::~string((string *)&local_40);
    local_44 = sVar2;
  }
  return local_44;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}